

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::RecordBytesSent(CConnman *this,uint64_t bytes)

{
  time_point tVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock95;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_28);
  this->nTotalBytesSent = this->nTotalBytesSent + bytes;
  tVar1 = NodeClock::now();
  if ((this->nMaxOutboundCycleStartTime).__r + 0x15180 < (long)tVar1.__d.__r / 1000000000) {
    (this->nMaxOutboundCycleStartTime).__r = (long)tVar1.__d.__r / 1000000000;
    this->nMaxOutboundTotalBytesSentInCycle = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = this->nMaxOutboundTotalBytesSentInCycle;
  }
  this->nMaxOutboundTotalBytesSentInCycle = uVar2 + bytes;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::RecordBytesSent(uint64_t bytes)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    LOCK(m_total_bytes_sent_mutex);

    nTotalBytesSent += bytes;

    const auto now = GetTime<std::chrono::seconds>();
    if (nMaxOutboundCycleStartTime + MAX_UPLOAD_TIMEFRAME < now)
    {
        // timeframe expired, reset cycle
        nMaxOutboundCycleStartTime = now;
        nMaxOutboundTotalBytesSentInCycle = 0;
    }

    nMaxOutboundTotalBytesSentInCycle += bytes;
}